

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O0

void av1_highbd_upsample_intra_edge_sse4_1(uint16_t *p,int sz,int bd)

{
  undefined1 auVar1 [16];
  short sVar2;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i sum1;
  __m128i sum0;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in24;
  __m128i in16;
  __m128i in8;
  __m128i in0;
  int n;
  uint16_t *out;
  uint16_t *in;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  int local_2bc;
  undefined1 (*local_2b8) [16];
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  __m128i out1;
  __m128i out0;
  __m128i max0;
  __m128i eight;
  __m128i coef0;
  __m128i d1;
  __m128i d0;
  
  *(undefined2 *)(in_RDI + -4) = *(undefined2 *)(in_RDI + -2);
  *(undefined2 *)(in_RDI + (long)in_ESI * 2) = *(undefined2 *)(in_RDI + (long)(in_ESI + -1) * 2);
  local_2b8 = (undefined1 (*) [16])(in_RDI + -4);
  local_2bc = in_ESI + 1;
  local_2d8 = lddqu(in_XMM0,*local_2b8);
  local_2e8 = lddqu(local_2d8,*(undefined1 (*) [16])(in_RDI + 0xc));
  local_2f8 = lddqu(local_2e8,*(undefined1 (*) [16])(in_RDI + 0x1c));
  local_308 = lddqu(local_2f8,*(undefined1 (*) [16])(in_RDI + 0x2c));
  for (; 0 < local_2bc; local_2bc = local_2bc + -8) {
    local_1f8 = local_2d8._0_2_;
    sStack_1f6 = local_2d8._2_2_;
    sStack_1f4 = local_2d8._4_2_;
    sStack_1f2 = local_2d8._6_2_;
    sStack_1f0 = local_2d8._8_2_;
    sStack_1ee = local_2d8._10_2_;
    sStack_1ec = local_2d8._12_2_;
    sStack_1ea = local_2d8._14_2_;
    sStack_1fe = local_2e8._0_2_;
    sStack_1fc = local_2e8._2_2_;
    sStack_1fa = local_2e8._4_2_;
    auVar3._14_2_ = sStack_1fe + sStack_1fc;
    local_368._0_4_ = CONCAT22(sStack_1f6 + sStack_1f4,local_1f8 + sStack_1f2);
    local_368._0_6_ = CONCAT24(sStack_1f6 + sStack_1f0,(undefined4)local_368);
    local_368 = CONCAT26(sStack_1f4 + sStack_1f2,(undefined6)local_368);
    uStack_360._0_2_ = sStack_1f4 + sStack_1ee;
    uStack_360._2_2_ = sStack_1f2 + sStack_1f0;
    uStack_360._4_2_ = sStack_1f2 + sStack_1ec;
    uStack_360._6_2_ = sStack_1f0 + sStack_1ee;
    auVar3._0_8_ = CONCAT26(sStack_1ec + sStack_1ea,
                            CONCAT24(sStack_1ee + sStack_1fe,
                                     CONCAT22(sStack_1ee + sStack_1ec,sStack_1f0 + sStack_1ea)));
    auVar3._8_2_ = sStack_1ec + sStack_1fc;
    auVar3._10_2_ = sStack_1ea + sStack_1fe;
    auVar3._12_2_ = sStack_1ea + sStack_1fa;
    auVar4 = lddqu(auVar3,(undefined1  [16])av1_highbd_upsample_intra_edge_sse4_1::kernel[0]);
    auVar5._8_8_ = uStack_360;
    auVar5._0_8_ = local_368;
    auVar5 = pmaddwd(auVar5,auVar4);
    uStack_370 = auVar3._8_8_;
    auVar6._8_8_ = uStack_370;
    auVar6._0_8_ = auVar3._0_8_;
    auVar6 = pmaddwd(auVar6,auVar4);
    local_d8 = auVar5._0_4_;
    iStack_d4 = auVar5._4_4_;
    iStack_d0 = auVar5._8_4_;
    iStack_cc = auVar5._12_4_;
    local_f8 = auVar6._0_4_;
    iStack_f4 = auVar6._4_4_;
    iStack_f0 = auVar6._8_4_;
    iStack_ec = auVar6._12_4_;
    auVar6 = ZEXT416(4);
    local_368 = CONCAT44(iStack_d4 + 8 >> auVar6,local_d8 + 8 >> auVar6);
    uStack_360._0_4_ = iStack_d0 + 8 >> auVar6;
    uStack_360._4_4_ = iStack_cc + 8 >> auVar6;
    auVar6 = ZEXT416(4);
    local_378 = CONCAT44(iStack_f4 + 8 >> auVar6,local_f8 + 8 >> auVar6);
    uStack_370._0_4_ = iStack_f0 + 8 >> auVar6;
    uStack_370._4_4_ = iStack_ec + 8 >> auVar6;
    auVar1._8_8_ = uStack_360;
    auVar1._0_8_ = local_368;
    auVar4._8_8_ = uStack_370;
    auVar4._0_8_ = local_378;
    auVar6 = packusdw(auVar1,auVar4);
    sVar2 = (short)(1 << (in_DL & 0x1f)) + -1;
    out0[1]._0_2_ = auVar6._0_2_;
    out0[1]._2_2_ = auVar6._2_2_;
    out0[1]._4_2_ = auVar6._4_2_;
    out0[1]._6_2_ = auVar6._6_2_;
    max0[0]._0_2_ = auVar6._8_2_;
    max0[0]._2_2_ = auVar6._10_2_;
    max0[0]._4_2_ = auVar6._12_2_;
    max0[0]._6_2_ = auVar6._14_2_;
    *(ulong *)*local_2b8 =
         CONCAT26((ushort)(sVar2 < out0[1]._2_2_) * sVar2 |
                  (ushort)(sVar2 >= out0[1]._2_2_) * out0[1]._2_2_,
                  CONCAT24(sStack_1f4,
                           CONCAT22((ushort)(sVar2 < (short)out0[1]) * sVar2 |
                                    (ushort)(sVar2 >= (short)out0[1]) * (short)out0[1],sStack_1f6)))
    ;
    *(ulong *)(*local_2b8 + 8) =
         CONCAT26((ushort)(sVar2 < out0[1]._6_2_) * sVar2 |
                  (ushort)(sVar2 >= out0[1]._6_2_) * out0[1]._6_2_,
                  CONCAT24(sStack_1f0,
                           CONCAT22((ushort)(sVar2 < out0[1]._4_2_) * sVar2 |
                                    (ushort)(sVar2 >= out0[1]._4_2_) * out0[1]._4_2_,sStack_1f2)));
    *(ulong *)local_2b8[1] =
         CONCAT26((ushort)(sVar2 < max0[0]._2_2_) * sVar2 |
                  (ushort)(sVar2 >= max0[0]._2_2_) * max0[0]._2_2_,
                  CONCAT24(sStack_1ec,
                           CONCAT22((ushort)(sVar2 < (short)max0[0]) * sVar2 |
                                    (ushort)(sVar2 >= (short)max0[0]) * (short)max0[0],sStack_1ee)))
    ;
    *(ulong *)(local_2b8[1] + 8) =
         CONCAT26((ushort)(sVar2 < max0[0]._6_2_) * sVar2 |
                  (ushort)(sVar2 >= max0[0]._6_2_) * max0[0]._6_2_,
                  CONCAT24(sStack_1fe,
                           CONCAT22((ushort)(sVar2 < max0[0]._4_2_) * sVar2 |
                                    (ushort)(sVar2 >= max0[0]._4_2_) * max0[0]._4_2_,sStack_1ea)));
    local_2d8 = local_2e8;
    local_2e8 = local_2f8;
    local_2f8 = local_308;
    local_308 = ZEXT816(0);
    local_2b8 = local_2b8 + 2;
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_sse4_1(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= 24);

  DECLARE_ALIGNED(16, static const int16_t,
                  kernel[1][8]) = { { -1, 9, -1, 9, -1, 9, -1, 9 } };

  // Extend first/last samples (upper-left p[-1], last p[sz-1])
  // to support 4-tap filter
  p[-2] = p[-1];
  p[sz] = p[sz - 1];

  uint16_t *in = &p[-2];
  uint16_t *out = in;
  int n = sz + 1;

  __m128i in0 = _mm_lddqu_si128((__m128i *)&in[0]);
  __m128i in8 = _mm_lddqu_si128((__m128i *)&in[8]);
  __m128i in16 = _mm_lddqu_si128((__m128i *)&in[16]);
  __m128i in24 = _mm_lddqu_si128((__m128i *)&in[24]);

  while (n > 0) {
    __m128i in1 = _mm_alignr_epi8(in8, in0, 2);
    __m128i in2 = _mm_alignr_epi8(in8, in0, 4);
    __m128i in3 = _mm_alignr_epi8(in8, in0, 6);
    __m128i sum0 = _mm_add_epi16(in0, in3);
    __m128i sum1 = _mm_add_epi16(in1, in2);
    __m128i d0 = _mm_unpacklo_epi16(sum0, sum1);
    __m128i d1 = _mm_unpackhi_epi16(sum0, sum1);
    __m128i coef0 = _mm_lddqu_si128((__m128i *)kernel[0]);
    d0 = _mm_madd_epi16(d0, coef0);
    d1 = _mm_madd_epi16(d1, coef0);
    __m128i eight = _mm_set1_epi32(8);
    d0 = _mm_add_epi32(d0, eight);
    d1 = _mm_add_epi32(d1, eight);
    d0 = _mm_srai_epi32(d0, 4);
    d1 = _mm_srai_epi32(d1, 4);
    d0 = _mm_packus_epi32(d0, d1);
    __m128i max0 = _mm_set1_epi16((1 << bd) - 1);
    d0 = _mm_min_epi16(d0, max0);
    __m128i out0 = _mm_unpacklo_epi16(in1, d0);
    __m128i out1 = _mm_unpackhi_epi16(in1, d0);
    _mm_storeu_si128((__m128i *)&out[0], out0);
    _mm_storeu_si128((__m128i *)&out[8], out1);
    in0 = in8;
    in8 = in16;
    in16 = in24;
    in24 = _mm_setzero_si128();
    out += 16;
    n -= 8;
  }
}